

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall
soul::StructuralParser::parseInPlaceOpExpression
          (StructuralParser *this,bool allowAssignment,Expression *lhs,Op opType)

{
  SourceCodeText *o;
  Expression *args_2;
  InPlaceOperator *pIVar1;
  TokenType *in_R9;
  Context context;
  Op local_84;
  Context local_80;
  Context local_68;
  CompileMessage local_50;
  
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_80.location.location.data = (this->super_SOULTokeniser).location.location.data;
  local_80.parentScope = this->currentScope;
  local_84 = opType;
  local_80.location.sourceCode.object = o;
  if (allowAssignment) {
    Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
    ::skip(&this->super_SOULTokeniser);
    args_2 = parseExpression(this,false);
    local_68.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
    if (local_68.location.sourceCode.object != (SourceCodeText *)0x0) {
      ((local_68.location.sourceCode.object)->super_RefCountedObject).refCount =
           ((local_68.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_68.location.location.data = (this->super_SOULTokeniser).location.location.data;
    local_68.parentScope = this->currentScope;
    pIVar1 = PoolAllocator::
             allocate<soul::AST::InPlaceOperator,soul::AST::Context,soul::AST::Expression&,soul::AST::Expression&,soul::BinaryOp::Op&>
                       (&this->allocator->pool,&local_68,lhs,args_2,&local_84);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
    return &pIVar1->super_Expression;
  }
  CompileMessageHelpers::createMessage<soul::TokenType&>
            (&local_50,(CompileMessageHelpers *)0x1,none,0x27b36c,
             (char *)&(this->super_SOULTokeniser).currentType,in_R9);
  AST::Context::throwError(&local_80,&local_50,false);
}

Assistant:

AST::Expression& parseInPlaceOpExpression (bool allowAssignment, AST::Expression& lhs, BinaryOp::Op opType)
    {
        auto context = getContext();

        if (! allowAssignment)
            context.throwError (Errors::inPlaceOperatorMustBeStatement (currentType));

        skip();
        auto& rhs = parseExpression();
        return allocate<AST::InPlaceOperator> (getContext(), lhs, rhs, opType);
    }